

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
::raw_hash_set(raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
               *this,raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
                     *that,allocator_type *a)

{
  _Head_base<0UL,_unsigned_long,_false> *p_Var1;
  ctrl_t *pcVar2;
  size_t sVar3;
  slot_type *psVar4;
  undefined1 auVar5 [16];
  anon_union_8_1_a8a14541_for_iterator_1 aVar6;
  size_t i;
  size_t hashval;
  EnumClass *key;
  FindInfo FVar7;
  const_iterator __begin0;
  iterator local_40;
  
  this->size_ = 0;
  this->capacity_ = 0;
  this->ctrl_ = (ctrl_t *)0x0;
  this->slots_ = (slot_type *)0x0;
  (this->settings_).
  super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
  .
  super__Tuple_impl<1UL,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
  .
  super__Tuple_impl<2UL,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
  .
  super__Tuple_impl<3UL,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
  .
  super__Head_base<3UL,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>,_false>
  ._M_head_impl.id_ = a->id_;
  sVar3 = (that->settings_).
          super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
          .
          super__Tuple_impl<1UL,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
          .super__Head_base<1UL,_phmap::priv::StatefulTestingHash,_false>._M_head_impl.
          super_WithId<phmap::priv::StatefulTestingHash>.id_;
  (this->settings_).
  super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
  .
  super__Tuple_impl<1UL,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
  .
  super__Tuple_impl<2UL,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
  .super__Head_base<2UL,_phmap::priv::StatefulTestingEqual,_false>._M_head_impl.
  super_WithId<phmap::priv::StatefulTestingEqual>.id_ =
       (that->settings_).
       super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
       .
       super__Tuple_impl<1UL,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
       .
       super__Tuple_impl<2UL,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
       .super__Head_base<2UL,_phmap::priv::StatefulTestingEqual,_false>._M_head_impl.
       super_WithId<phmap::priv::StatefulTestingEqual>.id_;
  (this->settings_).
  super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
  .
  super__Tuple_impl<1UL,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
  .super__Head_base<1UL,_phmap::priv::StatefulTestingHash,_false>._M_head_impl.
  super_WithId<phmap::priv::StatefulTestingHash>.id_ = sVar3;
  (this->settings_).
  super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
  .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = 0;
  rehash(this,that->capacity_);
  local_40 = begin(that);
  pcVar2 = that->ctrl_;
  sVar3 = that->capacity_;
  while (local_40.ctrl_ != pcVar2 + sVar3) {
    aVar6 = local_40.field_1;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = *(EnumClass *)local_40.field_1.slot_;
    hashval = SUB168(ZEXT816(0xde5fb9d2630458e9) * auVar5,8) +
              SUB168(ZEXT816(0xde5fb9d2630458e9) * auVar5,0);
    FVar7 = find_first_non_full(this,hashval);
    i = FVar7.offset;
    set_ctrl(this,i,(byte)hashval & 0x7f);
    psVar4 = this->slots_;
    psVar4[i].value.first = *(EnumClass *)aVar6.slot_;
    *(undefined4 *)((long)psVar4 + i * 0x10 + 8) = *(undefined4 *)((long)aVar6.slot_ + 8);
    iterator::operator++(&local_40);
  }
  sVar3 = that->size_;
  this->size_ = sVar3;
  p_Var1 = &(this->settings_).
            super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
            .super__Head_base<0UL,_unsigned_long,_false>;
  p_Var1->_M_head_impl = p_Var1->_M_head_impl - sVar3;
  return;
}

Assistant:

raw_hash_set(const raw_hash_set& that, const allocator_type& a)
        : raw_hash_set(0, that.hash_ref(), that.eq_ref(), a) {
        rehash(that.capacity());   // operator=() should preserve load_factor
        // Because the table is guaranteed to be empty, we can do something faster
        // than a full `insert`.
        for (const auto& v : that) {
            const size_t hashval = PolicyTraits::apply(HashElement{hash_ref()}, v);
            auto target = find_first_non_full(hashval);
            set_ctrl(target.offset, H2(hashval));
            emplace_at(target.offset, v);
            infoz_.RecordInsert(hashval, target.probe_length);
        }
        size_ = that.size();
        growth_left() -= that.size();
    }